

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  ulong *puVar7;
  uint *puVar8;
  byte in_DL;
  int __c;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  undefined8 extraout_RDX_02;
  long *in_RSI;
  long *in_RDI;
  int idx;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int k_1;
  DataArray<int> *rowscaleExp;
  int newColScaleExp;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec_1;
  int len;
  int k;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  int l;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  DataArray<int> newRows;
  int oldRowNumber;
  int oldColNumber;
  int j;
  int i;
  int in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6c0;
  int in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff6cc;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6d0;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff708;
  undefined7 in_stack_fffffffffffff710;
  undefined1 in_stack_fffffffffffff717;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff748;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff750;
  undefined1 local_854 [272];
  uint local_744;
  undefined1 local_740 [128];
  undefined1 local_6c0 [128];
  undefined1 local_640 [128];
  undefined1 local_5c0 [128];
  ulong local_540;
  undefined1 local_538 [128];
  undefined1 local_4b8 [128];
  undefined1 local_438 [128];
  undefined1 local_3b8 [128];
  DataArray<int> *local_338;
  int local_32c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_328;
  undefined4 local_320;
  undefined4 local_31c;
  int local_318;
  int local_314;
  int local_16c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_168;
  DataArray<int> local_150;
  int local_134;
  int local_130;
  uint local_12c;
  int local_128;
  byte local_121;
  long *local_120;
  undefined8 local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  ulong *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  ulong *local_10;
  undefined8 local_8;
  
  local_121 = in_DL & 1;
  local_120 = in_RSI;
  local_130 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a1627);
  local_134 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a163b);
  nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x6a164f);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc,
             in_stack_fffffffffffff6c8,(Real)in_stack_fffffffffffff6c0);
  if (local_120 != in_RDI + 0x19) {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT17(in_stack_fffffffffffff717,in_stack_fffffffffffff710),in_stack_fffffffffffff708
         );
  }
  local_128 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a16ca);
  while (local_128 = local_128 + -1, -1 < local_128) {
    piVar4 = DataArray<int>::operator[](&local_150,local_128);
    *piVar4 = 0;
  }
  local_128 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a1728);
  while (local_128 = local_128 + -1, -1 < local_128) {
    local_168 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    local_12c = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_168);
    uVar9 = extraout_RDX;
    while (local_12c = local_12c - 1, -1 < (int)local_12c) {
      pcVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_168,(char *)(ulong)local_12c,(int)uVar9);
      local_16c = (int)pcVar5;
      iVar2 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a17d9);
      if (iVar2 <= (int)pcVar5) {
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPRowBase(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6cc);
        DataArray<int>::reSize
                  ((DataArray<int> *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        for (local_314 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)0x6a182e); local_314 <= local_16c; local_314 = local_314 + 1) {
          piVar4 = DataArray<int>::operator[](&local_150,local_314);
          *piVar4 = 0;
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff6d0,
                (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8));
        }
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x6a18ce);
      }
      piVar4 = DataArray<int>::operator[](&local_150,local_16c);
      *piVar4 = *piVar4 + 1;
      uVar9 = extraout_RDX_00;
    }
  }
  for (local_128 = 0; iVar2 = local_128,
      iVar3 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a193d), iVar2 < iVar3; local_128 = local_128 + 1) {
    piVar4 = DataArray<int>::operator[](&local_150,local_128);
    if (0 < *piVar4) {
      piVar4 = DataArray<int>::operator[](&local_150,local_128);
      iVar2 = *piVar4;
      pSVar6 = rowVector(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      local_318 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar6);
      local_318 = iVar2 + local_318;
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::xtend(&in_stack_fffffffffffff6c0->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8);
      pSVar6 = rowVector_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::set_size(pSVar6,local_318);
    }
  }
  for (local_128 = local_130; iVar2 = local_128,
      iVar3 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x6a1a63), iVar2 < iVar3; local_128 = local_128 + 1) {
    if ((int)in_RDI[0x32] == 1) {
      local_31c = 1;
      in_stack_fffffffffffff750 =
           LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::maxObj_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                   (int *)in_stack_fffffffffffff6c0);
    }
    else {
      local_320 = 0xffffffff;
      in_stack_fffffffffffff748 =
           LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::maxObj_w((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
      ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                   (int *)in_stack_fffffffffffff6c0);
    }
    local_328 = colVector_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    local_32c = 0;
    local_338 = (DataArray<int> *)(in_RDI + 0x16);
    if ((local_121 & 1) != 0) {
      local_32c = (**(code **)(*(long *)in_RDI[0x43] + 8))((long *)in_RDI[0x43],local_328,local_338)
      ;
      upper(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      local_108 = infinity();
      local_100 = local_3b8;
      local_110 = 0;
      local_8 = local_108;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6d0,
                 (double)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                 in_stack_fffffffffffff6c0);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6a1c48);
      if (tVar1) {
        local_e0 = upper_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        local_d8 = local_4b8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
        local_58 = upper_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        local_60 = local_438;
        local_50 = local_60;
        local_18 = local_60;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      }
      lower(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      puVar7 = (ulong *)infinity();
      local_540 = *puVar7 ^ 0x8000000000000000;
      local_e8 = local_538;
      local_f0 = &local_540;
      local_f8 = 0;
      local_10 = local_f0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6d0,
                 (double)CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                 in_stack_fffffffffffff6c0);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6a1dc6);
      if (tVar1) {
        local_d0 = lower_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        local_c8 = local_640;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
        local_68 = lower_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
        local_70 = local_5c0;
        local_48 = local_70;
        local_20 = local_70;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      }
      local_c0 = maxObj_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      local_b8 = local_740;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
      local_78 = maxObj_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      local_80 = local_6c0;
      local_40 = local_80;
      local_28 = local_80;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      iVar2 = local_32c;
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),local_128);
      *piVar4 = iVar2;
    }
    local_12c = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_328);
    uVar9 = extraout_RDX_01;
    while (local_12c = local_12c - 1, -1 < (int)local_12c) {
      puVar8 = (uint *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::index(local_328,(char *)(ulong)local_12c,(int)uVar9);
      local_744 = *puVar8;
      local_854._260_8_ = rowVector_w(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_854._260_8_);
      piVar4 = DataArray<int>::operator[](&local_150,local_744);
      local_854._256_4_ = iVar2 - *piVar4;
      piVar4 = DataArray<int>::operator[](&local_150,local_744);
      iVar2 = local_128;
      *piVar4 = *piVar4 + -1;
      piVar4 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)local_854._260_8_,(char *)(ulong)(uint)local_854._256_4_,__c);
      *piVar4 = iVar2;
      if ((local_121 & 1) != 0) {
        local_b0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::value(local_328,local_12c);
        in_stack_fffffffffffff6d0 =
             (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_854;
        local_a8 = in_stack_fffffffffffff6d0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        in_stack_fffffffffffff6cc = local_32c;
        DataArray<int>::operator[](local_338,local_744);
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
        local_88 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::value(local_328,local_12c);
        local_90 = local_854 + 0x80;
        local_38 = local_90;
        local_30 = local_90;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      }
      in_stack_fffffffffffff6c0 =
           (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::value(local_328,local_12c);
      local_98 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)local_854._260_8_,local_854._256_4_);
      local_a0 = in_stack_fffffffffffff6c0;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff6c0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      uVar9 = extraout_RDX_02;
    }
  }
  iVar2 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x6a220e);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar2 - local_130);
  iVar2 = nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x6a2244);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar2 - local_134);
  DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff6c0);
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }